

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O1

void __thiscall duckdb::WindowBuilder::Sink(WindowBuilder *this,DataChunk *chunk,idx_t input_idx)

{
  optional_ptr<duckdb::ColumnDataCollection,_true> *this_00;
  ulong uVar1;
  reference pvVar2;
  reference this_01;
  size_type __n;
  UnifiedVectorFormat data;
  UnifiedVectorFormat UStack_78;
  
  this_00 = &(this->sink).second;
  if (((this->sink).second.ptr != (ColumnDataCollection *)0x0) &&
     (uVar1 = (this->sink).first, uVar1 <= input_idx)) {
    optional_ptr<duckdb::ColumnDataCollection,_true>::CheckValid(this_00);
    if (input_idx <= uVar1 + this_00->ptr->count) goto LAB_011c2794;
  }
  WindowCollection::GetCollection(this->collection,input_idx,&this->sink);
  optional_ptr<duckdb::ColumnDataCollection,_true>::CheckValid(this_00);
  ColumnDataCollection::InitializeAppend((this->sink).second.ptr,&this->appender);
LAB_011c2794:
  optional_ptr<duckdb::ColumnDataCollection,_true>::CheckValid(this_00);
  ColumnDataCollection::Append((this->sink).second.ptr,&this->appender,chunk);
  if ((chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar2 = vector<std::atomic<bool>,_true>::operator[](&this->collection->all_valids,__n);
      if (((pvVar2->_M_base)._M_i & 1U) != 0) {
        UnifiedVectorFormat::UnifiedVectorFormat(&UStack_78);
        this_01 = vector<duckdb::Vector,_true>::operator[](&chunk->data,__n);
        Vector::ToUnifiedFormat(this_01,chunk->count,&UStack_78);
        if (UStack_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          pvVar2 = vector<std::atomic<bool>,_true>::operator[](&this->collection->all_valids,__n);
          LOCK();
          (pvVar2->_M_base)._M_i = false;
          UNLOCK();
        }
        if (UStack_78.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (UStack_78.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (UStack_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (UStack_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void WindowBuilder::Sink(DataChunk &chunk, idx_t input_idx) {
	// Check whether we need a a new collection
	if (!sink.second || input_idx < sink.first || sink.first + sink.second->Count() < input_idx) {
		collection.GetCollection(input_idx, sink);
		D_ASSERT(sink.second);
		sink.second->InitializeAppend(appender);
	}
	sink.second->Append(appender, chunk);

	// Record NULLs
	for (column_t col_idx = 0; col_idx < chunk.ColumnCount(); ++col_idx) {
		if (!collection.all_valids[col_idx]) {
			continue;
		}

		// Column was valid, make sure it still is.
		UnifiedVectorFormat data;
		chunk.data[col_idx].ToUnifiedFormat(chunk.size(), data);
		if (!data.validity.AllValid()) {
			collection.all_valids[col_idx] = false;
		}
	}
}